

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# colList.c
# Opt level: O0

void Col_MListSetLength(Col_Word mlist,size_t length)

{
  size_t index;
  size_t into;
  Col_Word CVar1;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  byte *local_30;
  Col_Word root;
  size_t listLoop;
  size_t listLength;
  size_t length_local;
  Col_Word mlist_local;
  
  local_30 = *(byte **)(mlist + 0x10);
  listLength = length;
  length_local = mlist;
  if (length == 0) {
    if (local_30 == (byte *)0x0) {
      local_34 = 0;
    }
    else {
      if (((ulong)local_30 & 0xf) == 0) {
        if ((*local_30 & 2) == 0) {
          local_3c = 0xffffffff;
        }
        else {
          local_3c = *local_30 & 0xfffffffe;
        }
        local_38 = local_3c;
      }
      else {
        local_38 = immediateWordTypes[(ulong)local_30 & 0x1f];
      }
      local_34 = local_38;
    }
    if (local_34 == 0x1a) {
      Col_MVectorSetLength((Col_Word)local_30,0);
    }
    else {
      *(undefined8 *)(mlist + 0x10) = 0x14;
    }
  }
  else {
    listLoop = Col_ListLength(mlist);
    root = Col_ListLoopLength(length_local);
    into = length_local;
    index = listLoop;
    if ((root == 0) || (root != listLoop)) {
      if (root == 0) {
        if (listLoop < listLength) {
          CVar1 = Col_NewList(listLength - listLoop,(Col_Word *)0x0);
          Col_MListInsert(into,index,CVar1);
        }
        else if (listLength < listLoop) {
          Col_MListRemove(length_local,listLength,listLoop - 1);
        }
      }
      else if (listLoop - root < listLength) {
        if (local_30 == (byte *)0x0) {
          local_40 = 0;
        }
        else {
          if (((ulong)local_30 & 0xf) == 0) {
            if ((*local_30 & 2) == 0) {
              local_48 = 0xffffffff;
            }
            else {
              local_48 = *local_30 & 0xfffffffe;
            }
            local_44 = local_48;
          }
          else {
            local_44 = immediateWordTypes[(ulong)local_30 & 0x1f];
          }
          local_40 = local_44;
        }
        if (local_40 != 0x26) {
          ConvertToMConcatNode((Col_Word *)&local_30);
        }
        *(undefined8 *)(length_local + 0x10) = *(undefined8 *)(local_30 + 0x18);
        Col_MListSetLength(length_local,listLength - (listLoop - root));
        *(undefined8 *)(local_30 + 0x18) = *(undefined8 *)(length_local + 0x10);
        UpdateMConcatNode((Col_Word)local_30);
        *(byte **)(length_local + 0x10) = local_30;
      }
      else {
        *(undefined8 *)(length_local + 0x10) = *(undefined8 *)(local_30 + 0x10);
        Col_MListSetLength(length_local,listLength);
      }
    }
    else if (listLoop < listLength) {
      CVar1 = Col_Sublist((Col_Word)local_30,0,listLength - 1);
      *(Col_Word *)(length_local + 0x10) = CVar1;
    }
    else {
      *(ulong *)(length_local + 0x10) = (ulong)local_30 & 0xfffffffffffffff7;
      Col_MListSetLength(length_local,listLength);
    }
  }
  return;
}

Assistant:

void
Col_MListSetLength(
    Col_Word mlist, /*!< Mutable list to resize. */
    size_t length)  /*!< New length. */
{
    size_t listLength, listLoop;
    Col_Word root;

    /*
     * Check preconditions.
     */

    /*! @typecheck{COL_ERROR_MLIST,mlist} */
    TYPECHECK_MLIST(mlist) return;

    ASSERT(WORD_TYPE(mlist) == WORD_TYPE_WRAP);
    root = WORD_WRAP_SOURCE(mlist);

    if (length == 0) {
        /*
         * Empty list.
         */


        switch (WORD_TYPE(root)) {
        case WORD_TYPE_MVECTOR:
            /*
             * Shrink mutable vector so as to preserve its capacity should the
             * list length grow in the future.
             */

            Col_MVectorSetLength(root, 0);
            break;

        default:
            WORD_WRAP_SOURCE(mlist) = WORD_LIST_EMPTY;
        }
        return;
    }

    listLength = Col_ListLength(mlist);
    listLoop = Col_ListLoopLength(mlist);
    if (listLoop && listLoop == listLength) {
        /*
         * List is circular.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CIRCLIST);
        if (length <= listLength) {
            /*
             * Shorten loop.
             */

            WORD_WRAP_SOURCE(mlist) = WORD_CIRCLIST_CORE(root);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Sublist of circular list.
             */

            WORD_WRAP_SOURCE(mlist) = Col_Sublist(root, 0, length-1);
        }
        return;
    } else if (listLoop) {
        /*
         * List is cyclic.
         */

        ASSERT(WORD_TYPE(root) == WORD_TYPE_CONCATLIST || WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
        ASSERT(WORD_TYPE(WORD_CONCATLIST_RIGHT(root)) == WORD_TYPE_CIRCLIST);

        if (length <= listLength-listLoop) {
            /*
             * Keep head.
             */

            ASSERT(listLoop < listLength);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_LEFT(root);
            ASSERT(Col_ListLength(mlist) >= length);
            Col_MListSetLength(mlist, length);
        } else {
            /*
             * Shorten tail. Temporarily use tail as root before recursive call.
             */

            if (WORD_TYPE(root) != WORD_TYPE_MCONCATLIST) {
                ConvertToMConcatNode(&root);
            }
            ASSERT(WORD_TYPE(root) == WORD_TYPE_MCONCATLIST);
            WORD_WRAP_SOURCE(mlist) = WORD_CONCATLIST_RIGHT(root);
            Col_MListSetLength(mlist, length - (listLength-listLoop));
            WORD_CONCATLIST_RIGHT(root) = WORD_WRAP_SOURCE(mlist);
            UpdateMConcatNode(root);
            WORD_WRAP_SOURCE(mlist) = root;
        }
        return;
    }

    /*
     * Acyclic list.
     */

    if (listLength < length) {
        /*
         * Append void list.
         */

        Col_MListInsert(mlist, listLength, Col_NewList(length - listLength,
                NULL));
    } else if (listLength > length) {
        /*
         * Remove tail.
         */

        Col_MListRemove(mlist, length, listLength-1);
    }
}